

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t http2_handle_stream_close(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream,CURLcode *err)

{
  uint uVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t sVar4;
  ulong local_68;
  size_t i;
  dynbuf dbuf;
  dynhds_entry *e;
  ssize_t rv;
  CURLcode *err_local;
  stream_ctx *stream_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if (stream->error == 7) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[%d] REFUSED_STREAM, try again on a new connection",
                        (ulong)(uint)stream->id);
    }
    Curl_conncontrol(cf->conn,1);
    *(uint *)&(data->state).field_0x74c = *(uint *)&(data->state).field_0x74c & 0xfffffffb | 4;
    *err = CURLE_RECV_ERROR;
    return -1;
  }
  if (stream->error != 0) {
    uVar1 = stream->id;
    pcVar3 = nghttp2_http2_strerror(stream->error);
    Curl_failf(data,"HTTP/2 stream %u was not closed cleanly: %s (err %u)",(ulong)uVar1,pcVar3,
               (ulong)stream->error);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }
  if ((stream->reset & 1U) != 0) {
    Curl_failf(data,"HTTP/2 stream %u was reset",(ulong)(uint)stream->id);
    CVar2 = CURLE_RECV_ERROR;
    if ((stream->bodystarted & 1U) != 0) {
      CVar2 = CURLE_PARTIAL_FILE;
    }
    *err = CVar2;
    return -1;
  }
  if ((stream->bodystarted & 1U) == 0) {
    Curl_failf(data,
               "HTTP/2 stream %u was closed cleanly, but before getting  all response header fields, treated as error"
               ,(ulong)(uint)stream->id);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }
  sVar4 = Curl_dynhds_count(&stream->resp_trailers);
  if (sVar4 != 0) {
    *err = CURLE_OK;
    Curl_dyn_init((dynbuf *)&i,0x10000);
    local_68 = 0;
    while ((sVar4 = Curl_dynhds_count(&stream->resp_trailers), local_68 < sVar4 &&
           (dbuf.toobig = (size_t)Curl_dynhds_getn(&stream->resp_trailers,local_68),
           (dynhds_entry *)dbuf.toobig != (dynhds_entry *)0x0))) {
      Curl_dyn_reset((dynbuf *)&i);
      CVar2 = Curl_dyn_addf((dynbuf *)&i,"%.*s: %.*s\r\n",
                            *(ulong *)(dbuf.toobig + 0x10) & 0xffffffff,*(undefined8 *)dbuf.toobig,
                            *(ulong *)(dbuf.toobig + 0x18) & 0xffffffff,
                            *(undefined8 *)(dbuf.toobig + 8));
      *err = CVar2;
      if (*err != CURLE_OK) break;
      pcVar3 = Curl_dyn_ptr((dynbuf *)&i);
      sVar4 = Curl_dyn_len((dynbuf *)&i);
      Curl_debug(data,CURLINFO_HEADER_IN,pcVar3,sVar4);
      pcVar3 = Curl_dyn_ptr((dynbuf *)&i);
      sVar4 = Curl_dyn_len((dynbuf *)&i);
      CVar2 = Curl_client_write(data,0x44,pcVar3,sVar4);
      *err = CVar2;
      if (*err != CURLE_OK) break;
      local_68 = local_68 + 1;
    }
    Curl_dyn_free((dynbuf *)&i);
    if (*err != CURLE_OK) goto LAB_0016c1bb;
  }
  stream->close_handled = true;
  *err = CURLE_OK;
LAB_0016c1bb:
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"handle_stream_close -> %zd, %d",0,(ulong)*err);
  }
  return 0;
}

Assistant:

static ssize_t http2_handle_stream_close(struct Curl_cfilter *cf,
                                         struct Curl_easy *data,
                                         struct stream_ctx *stream,
                                         CURLcode *err)
{
  ssize_t rv = 0;

  if(stream->error == NGHTTP2_REFUSED_STREAM) {
    CURL_TRC_CF(data, cf, "[%d] REFUSED_STREAM, try again on a new "
                "connection", stream->id);
    connclose(cf->conn, "REFUSED_STREAM"); /* don't use this anymore */
    data->state.refused_stream = TRUE;
    *err = CURLE_RECV_ERROR; /* trigger Curl_retry_request() later */
    return -1;
  }
  else if(stream->error != NGHTTP2_NO_ERROR) {
    failf(data, "HTTP/2 stream %u was not closed cleanly: %s (err %u)",
          stream->id, nghttp2_http2_strerror(stream->error),
          stream->error);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }
  else if(stream->reset) {
    failf(data, "HTTP/2 stream %u was reset", stream->id);
    *err = stream->bodystarted? CURLE_PARTIAL_FILE : CURLE_RECV_ERROR;
    return -1;
  }

  if(!stream->bodystarted) {
    failf(data, "HTTP/2 stream %u was closed cleanly, but before getting "
          " all response header fields, treated as error",
          stream->id);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(Curl_dynhds_count(&stream->resp_trailers)) {
    struct dynhds_entry *e;
    struct dynbuf dbuf;
    size_t i;

    *err = CURLE_OK;
    Curl_dyn_init(&dbuf, DYN_TRAILERS);
    for(i = 0; i < Curl_dynhds_count(&stream->resp_trailers); ++i) {
      e = Curl_dynhds_getn(&stream->resp_trailers, i);
      if(!e)
        break;
      Curl_dyn_reset(&dbuf);
      *err = Curl_dyn_addf(&dbuf, "%.*s: %.*s\x0d\x0a",
                          (int)e->namelen, e->name,
                          (int)e->valuelen, e->value);
      if(*err)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, Curl_dyn_ptr(&dbuf),
                 Curl_dyn_len(&dbuf));
      *err = Curl_client_write(data, CLIENTWRITE_HEADER|CLIENTWRITE_TRAILER,
                               Curl_dyn_ptr(&dbuf), Curl_dyn_len(&dbuf));
      if(*err)
        break;
    }
    Curl_dyn_free(&dbuf);
    if(*err)
      goto out;
  }

  stream->close_handled = TRUE;
  *err = CURLE_OK;
  rv = 0;

out:
  CURL_TRC_CF(data, cf, "handle_stream_close -> %zd, %d", rv, *err);
  return rv;
}